

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residual_functions.h
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
IsobarImposedRho0VLEResiduals<double>::call
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          IsobarImposedRho0VLEResiduals<double> *this,
          vector<double,_std::allocator<double>_> *lnrhovec)

{
  vector<double,_std::allocator<double>_> *this_00;
  MixDerivs<double> *pMVar1;
  _Head_base<0UL,_const_MixDerivs<double>_*,_false> this_01;
  _Head_base<0UL,_const_MixDerivs<double>_*,_false> this_02;
  pointer pdVar2;
  size_t sVar3;
  CoolPropBaseError *this_03;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  pointer *__ptr;
  size_type sVar7;
  double dVar8;
  ArrayXd rhovecL;
  double T;
  ArrayXd rhovecV;
  vector<double,_std::allocator<double>_> _rhovecL;
  vector<double,_std::allocator<double>_> _rhovecV;
  _Any_data local_e8;
  double *local_d8;
  long local_d0;
  pointer local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double *local_a8;
  long local_a0;
  string local_98;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_58;
  double local_40;
  double local_38;
  double local_30;
  
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  unpack(this,lnrhovec,(double *)&local_c8,&local_78,&local_58);
  sVar7 = (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_98._M_dataplus._M_p =
       (pointer)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_98._M_string_length = sVar7;
  if ((long)sVar7 < 0) {
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/MapBase.h"
                  ,0xa3,
                  "Eigen::MapBase<Eigen::Map<const Eigen::Array<double, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Array<double, -1, 1>>, Level = 0]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_d8,
             (DenseBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_98);
  local_98._M_dataplus._M_p =
       (pointer)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_98._M_string_length = sVar7;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_a8,
             (DenseBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_98);
  local_98._M_dataplus._M_p = local_c8;
  if ((this->m_factory).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  else {
    (*(this->m_factory)._M_invoker)
              (&local_e8,(double *)&this->m_factory,(Array<double,__1,_1,_0,__1,_1> *)&local_98);
    uVar4 = local_e8._M_unused._0_8_;
    local_e8._M_unused._M_object = (MixDerivs<double> *)0x0;
    pMVar1 = (this->m_derL)._M_t.
             super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
             .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
    (this->m_derL)._M_t.
    super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>.
    _M_t.
    super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
    .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl =
         (MixDerivs<double> *)uVar4;
    if (pMVar1 != (MixDerivs<double> *)0x0) {
      std::default_delete<const_MixDerivs<double>_>::operator()
                ((default_delete<const_MixDerivs<double>_> *)&this->m_derL,pMVar1);
    }
    if ((MixDerivs<double> *)local_e8._M_unused._0_8_ != (MixDerivs<double> *)0x0) {
      std::default_delete<const_MixDerivs<double>_>::operator()
                ((default_delete<const_MixDerivs<double>_> *)local_e8._M_pod_data,
                 (MixDerivs<double> *)local_e8._M_unused._0_8_);
    }
    local_98._M_dataplus._M_p = local_c8;
    if ((this->m_factory).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_factory)._M_invoker)
                (&local_e8,(double *)&this->m_factory,(Array<double,__1,_1,_0,__1,_1> *)&local_98);
      uVar4 = local_e8._M_unused._0_8_;
      local_e8._M_unused._M_object = (MixDerivs<double> *)0x0;
      pMVar1 = (this->m_derV)._M_t.
               super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
               .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
      (this->m_derV)._M_t.
      super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
      .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl =
           (MixDerivs<double> *)uVar4;
      if (pMVar1 != (MixDerivs<double> *)0x0) {
        std::default_delete<const_MixDerivs<double>_>::operator()
                  ((default_delete<const_MixDerivs<double>_> *)&this->m_derV,pMVar1);
      }
      if ((MixDerivs<double> *)local_e8._M_unused._0_8_ != (MixDerivs<double> *)0x0) {
        std::default_delete<const_MixDerivs<double>_>::operator()
                  ((default_delete<const_MixDerivs<double>_> *)local_e8._M_pod_data,
                   (MixDerivs<double> *)local_e8._M_unused._0_8_);
      }
      this_01._M_head_impl =
           (this->m_derL)._M_t.
           super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
           .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
      this_02._M_head_impl =
           (this->m_derV)._M_t.
           super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
           .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
      local_e8._8_8_ = (this_01._M_head_impl)->R;
      local_30 = MixDerivs<double>::p(this_01._M_head_impl);
      local_b0 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_01._M_head_impl,0);
      local_b8 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_01._M_head_impl,1);
      local_38 = MixDerivs<double>::p(this_02._M_head_impl);
      local_c0 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_02._M_head_impl,0);
      local_40 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_02._M_head_impl,1);
      this_00 = &this->y;
      std::vector<double,_std::allocator<double>_>::resize(this_00,5);
      if ((0 < local_d0) && (0 < local_a0)) {
        local_b0 = local_b0 - local_c0;
        local_c0 = (double)local_c8 * (double)local_e8._8_8_;
        dVar8 = log(*local_d8 / *local_a8);
        *(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start = dVar8 * local_c0 + local_b0;
        if ((1 < local_d0) && (1 < local_a0)) {
          local_b8 = local_b8 - local_40;
          local_e8._8_8_ = (double)local_e8._8_8_ * (double)local_c8;
          dVar8 = log(local_d8[1] / local_a8[1]);
          pdVar2 = (this->y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2[1] = dVar8 * (double)local_e8._8_8_ + local_b8;
          pdVar2[2] = local_30 - this->m_p;
          pdVar2[3] = local_38 - this->m_p;
          sVar3 = this->m_imposed_index;
          if ((-1 < (long)sVar3) && ((long)sVar3 < local_d0)) {
            pdVar2[4] = local_d8[sVar3] - this->m_rho0;
            lVar5 = (long)(this->y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar2;
            if (lVar5 != 0) {
              lVar5 = lVar5 >> 3;
              lVar6 = 0;
              do {
                if (1.79769313486232e+308 < ABS(pdVar2[lVar6])) {
                  this_03 = (CoolPropBaseError *)__cxa_allocate_exception(0x30);
                  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_98,"Invalid value found","");
                  CoolProp::CoolPropBaseError::CoolPropBaseError(this_03,&local_98,eValue);
                  *(undefined ***)this_03 = &PTR__CoolPropBaseError_001abf40;
                  __cxa_throw(this_03,&CoolProp::
                                       CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::
                                       typeinfo,CoolProp::CoolPropBaseError::~CoolPropBaseError);
                }
                lVar6 = lVar6 + 1;
              } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
            }
            std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,this_00);
            free(local_a8);
            free(local_d8);
            if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_58.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            return __return_storage_ptr__;
          }
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0xa2,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Array<double, -1, 1>, Level = 0]"
                   );
    }
  }
  uVar4 = std::__throw_bad_function_call();
  free(local_a8);
  free(local_d8);
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

std::vector<TYPE> call(const std::vector<TYPE> &lnrhovec) {
        TYPE T; std::vector<TYPE> _rhovecL, _rhovecV;
        unpack(lnrhovec, T, _rhovecL, _rhovecV);

        auto N = _rhovecL.size();
        const Eigen::ArrayXd rhovecL = Eigen::Map<const Eigen::ArrayXd>(&(_rhovecL[0]), N);
        const Eigen::ArrayXd rhovecV = Eigen::Map<const Eigen::ArrayXd>(&(_rhovecV[0]), N);

        m_derL = m_factory(T, rhovecL);
        m_derV = m_factory(T, rhovecV);
        auto &derL = *(m_derL.get()), &derV = *(m_derV.get()); TYPE R = derL.R;

        TYPE pL = derL.p(), chempotr0L = derL.dpsir_drhoi__constTrhoj(0), chempotr1L = derL.dpsir_drhoi__constTrhoj(1);
        TYPE pV = derV.p(), chempotr0V = derV.dpsir_drhoi__constTrhoj(0), chempotr1V = derV.dpsir_drhoi__constTrhoj(1);

        y.resize(5);
        y[0] = chempotr0L - chempotr0V + R*T*log(rhovecL[0] / rhovecV[0]);
        y[1] = chempotr1L - chempotr1V + R*T*log(rhovecL[1] / rhovecV[1]);
        y[2] = pL - m_p;
        y[3] = pV - m_p;
        y[4] = rhovecL[m_imposed_index] - m_rho0;
        for (std::size_t i = 0; i < y.size(); ++i) {
            if (!ValidNumber(y[i])) {
                throw ValueError("Invalid value found");
            }
        }
        return y;
    }